

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoMeshBuilder.cpp
# Opt level: O1

TPZGeoEl *
TPZGeoMeshBuilder::InsertElement
          (TPZGeoMesh *gmesh,int *physical_identifier,int *el_type,int *el_identifier,
          vector<int,_std::allocator<int>_> *node_identifiers)

{
  int iVar1;
  pointer piVar2;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *this;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  TPZManVector<long,_15> local_d0;
  long local_38;
  
  TPZVec<long>::TPZVec(&local_d0.super_TPZVec<long>,0);
  local_d0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5578;
  local_d0.super_TPZVec<long>.fStore = local_d0.fExtAlloc;
  local_d0.super_TPZVec<long>.fNElements = 0;
  local_d0.super_TPZVec<long>.fNAlloc = 0;
  uVar5 = (uint)((ulong)((long)(node_identifiers->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(node_identifiers->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_38 = 0;
  TPZManVector<long,_15>::Resize(&local_d0,(long)(int)uVar5,&local_38);
  if (0 < (int)uVar5) {
    piVar2 = (node_identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      local_d0.super_TPZVec<long>.fStore[uVar3] = (long)piVar2[uVar3] + -1;
      uVar3 = uVar3 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar3);
  }
  iVar1 = *el_identifier;
  iVar4 = (int)((long)iVar1 + -1);
  *el_identifier = iVar4;
  switch(*el_type) {
  case 1:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(200);
    TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)this,(long)iVar1 + -1,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 2:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x130);
    TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 3:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x168);
    TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 4:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x1f8);
    TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 5:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x338);
    TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 6:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x298);
    TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 7:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x260);
    TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 8:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0xd0);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticLine>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticLine> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 9:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x148);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 10:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x188);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticQuad> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 0xb:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x228);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 0xc:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x398);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticCube>::TPZGeoElRefPattern
              (this,(long)iVar4,&local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  case 0xd:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x2e0);
    TPZGeoElRefPattern<pzgeom::TPZQuadraticPrism>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZQuadraticPrism> *)this,(long)iVar4,
               &local_d0.super_TPZVec<long>,*physical_identifier,gmesh);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Element not impelemented.",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGeoMeshBuilder.cpp"
               ,0x8a);
  case 0xf:
    this = (TPZGeoElRefPattern<pzgeom::TPZQuadraticCube> *)operator_new(0x70);
    iVar1 = *physical_identifier;
    *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticCube>).super_TPZGeoEl =
         &PTR__TPZSavable_01934fe8;
    TPZGeoElRefLess<pzgeom::TPZGeoPoint>::TPZGeoElRefLess
              ((TPZGeoElRefLess<pzgeom::TPZGeoPoint> *)this,&PTR_PTR_019348d8,(long)iVar4,
               &local_d0.super_TPZVec<long>,iVar1,gmesh);
    *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticCube>).super_TPZGeoEl =
         &PTR__TPZGeoElement_019345d8;
    (this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticCube>).fGeo.
    super_TPZNodeRep<20,_pztopology::TPZCube>.fNodeIndexes[4] = 0xffffffffffffffff;
  }
  if (local_d0.super_TPZVec<long>.fStore == local_d0.fExtAlloc) {
    local_d0.super_TPZVec<long>.fStore = (long *)0x0;
  }
  local_d0.super_TPZVec<long>.fNAlloc = 0;
  local_d0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_d0.super_TPZVec<long>.fStore != (long *)0x0) {
    operator_delete__(local_d0.super_TPZVec<long>.fStore);
  }
  return (TPZGeoEl *)this;
}

Assistant:

TPZGeoEl* TPZGeoMeshBuilder::InsertElement(TPZGeoMesh * gmesh, int & physical_identifier, int & el_type, int & el_identifier, std::vector<int> & node_identifiers){
    
    TPZManVector <int64_t,15> Topology;
    int n_nodes = node_identifiers.size();
    Topology.Resize(n_nodes, 0);
    for (int k_node = 0; k_node<n_nodes; k_node++) {
        Topology[k_node] = node_identifiers[k_node]-1;
    }
    TPZGeoEl* gel = nullptr;
    el_identifier--;
    switch (el_type) {
        case 1:
        {   // Line
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoLinear> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 2:
        {
            // Triangle
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoTriangle> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 3:
        {
            // Quadrilateral
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoQuad> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 4:
        {
            // Tetrahedron
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoTetrahedra> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 5:
        {
            // Hexahedra
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoCube> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 6:
        {
            // Prism
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoPrism> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 7:
        {
            // Pyramid
            gel = new TPZGeoElRefPattern< pzgeom::TPZGeoPyramid> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 8:
        {
            // Quadratic Line
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticLine> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 9:
        {
            // Triangle
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticTrig> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 10:
        {
            // Quadrilateral
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticQuad> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 11:
        {
            // Tetrahedron
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticTetra> (el_identifier, Topology, physical_identifier, *gmesh);
            
        }
            break;
        case 12:
        {
            // Hexahedra
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticCube> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 13:
        {
            // Prism
            gel = new TPZGeoElRefPattern< pzgeom::TPZQuadraticPrism> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        case 15:{
            // Point
            gel = new TPZGeoElement< pzgeom::TPZGeoPoint, pzrefine::TPZRefPoint> (el_identifier, Topology, physical_identifier, *gmesh);
        }
            break;
        default:
        {
            std::cout << "Element not impelemented." << std::endl;
            DebugStop();
        }
            break;
    }
    return gel;
}